

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QString * __thiscall
QList<QString>::takeAt(QString *__return_storage_ptr__,QList<QString> *this,qsizetype i)

{
  pointer pQVar1;
  
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar1 = data(this);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&pQVar1[i].d);
  remove(this,(char *)i);
  return __return_storage_ptr__;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }